

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.c
# Opt level: O1

void DeInit(void)

{
  if (WaterVoice != (ALLEGRO_SAMPLE_INSTANCE *)0x0) {
    al_stop_sample_instance();
    al_destroy_sample_instance(WaterVoice);
    WaterVoice = (ALLEGRO_SAMPLE_INSTANCE *)0x0;
  }
  if (WaterVoice2 != (ALLEGRO_SAMPLE_INSTANCE *)0x0) {
    al_stop_sample_instance();
    al_destroy_sample_instance(WaterVoice2);
    WaterVoice2 = (ALLEGRO_SAMPLE_INSTANCE *)0x0;
  }
  PauseAnimation(PlayerAnim);
  return;
}

Assistant:

static void DeInit(void)
{
   if (WaterVoice) {
      al_stop_sample_instance(WaterVoice);
      al_destroy_sample_instance(WaterVoice);
      WaterVoice = NULL;
   }
   if (WaterVoice2) {
      al_stop_sample_instance(WaterVoice2);
      al_destroy_sample_instance(WaterVoice2);
      WaterVoice2 = NULL;
   }
   PauseAnimation(PlayerAnim);
}